

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  LazyLoadCallback *pLVar1;
  int in_EAX;
  int extraout_EAX;
  Fault f;
  RawSchema *schema_local;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  RawSchema *mutableSchema;
  
  pLVar1 = (this->callback).ptr;
  schema_local = (RawSchema *)ctx;
  if (pLVar1 != (LazyLoadCallback *)0x0) {
    in_EAX = (*(code *)**(undefined8 **)pLVar1)(pLVar1,this->loader,*(undefined8 *)ctx);
  }
  if (*(long *)(ctx + 0x40) != 0) {
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&lock,
               this->loader);
    Impl::tryGet((Impl *)&_kjCondition,(uint64_t)(lock.ptr)->ptr);
    mutableSchema = (RawSchema *)_kjCondition.left;
    _kjCondition.right = &schema_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (EVP_PKEY_CTX *)_kjCondition.left == ctx;
    if (!_kjCondition.result) {
      _kjCondition.left = &mutableSchema;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema*&,capnp::_::RawSchema_const*&>&,char_const(&)[60]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x823,FAILED,"mutableSchema == schema",
                 "_kjCondition,\"A schema not belonging to this loader used its initializer.\"",
                 &_kjCondition,
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&f);
    }
    _kjCondition.left[8] = (RawSchema *)0x0;
    _kjCondition.left[0xd] = (RawSchema *)0x0;
    _kjCondition.left = &mutableSchema;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked(&lock);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_SOME(c, callback) {
    c.load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__ || defined(__clang__)
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}